

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TiledInputFile::rawTileData
          (TiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  ArgExc *pAVar6;
  mutex *__mutex;
  exr_chunk_info_t cinfo;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  iVar3 = exr_read_tile_chunk_info
                    (*(this->_ctxt)._ctxt.
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     ((this->_data).
                      super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->partNumber,*dx,*dy,*lx,*ly,&cinfo);
  if (iVar3 != 0) {
    bVar2 = isValidTile(this,*dx,*dy,*lx,*ly);
    iex_debugTrap();
    if (bVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar4 = std::operator<<(local_1a8,
                               "Error reading chunk information for tile from image file \"");
      pcVar5 = Context::fileName(&this->_ctxt);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::operator<<(poVar4,"\". Unable to read raw tile offset information.");
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)&_iex_throw_s);
      __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar4 = std::operator<<(local_1a8,"Error reading pixel data from image file \"");
    pcVar5 = Context::fileName(&this->_ctxt);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\". ");
    std::operator<<(poVar4,"Tried to read a tile outside the image file\'s data window.");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_mx;
  std::mutex::lock(__mutex);
  std::vector<char,_std::allocator<char>_>::resize
            (&((this->_data).
               super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_tile_data_scratch,CONCAT44(cinfo.packed_size._4_4_,(int)cinfo.packed_size));
  *pixelDataSize = (int)cinfo.packed_size;
  peVar1 = (this->_data).
           super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar3 = exr_read_chunk(*(this->_ctxt)._ctxt.
                          super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,peVar1->partNumber,&cinfo,
                         (peVar1->_tile_data_scratch).
                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
  if (iVar3 == 0) {
    *pixelData = (((this->_data).
                   super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_tile_data_scratch).super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    *dx = cinfo.start_x;
    *dy = cinfo.start_y;
    *lx = (uint)cinfo.level_x;
    *ly = (uint)cinfo.level_y;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar4 = std::operator<<(local_1a8,"Error reading pixel data from image file \"");
  pcVar5 = Context::fileName(&this->_ctxt);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"\". Unable to read raw tile data of ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*pixelDataSize);
  std::operator<<(poVar4," bytes.");
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledInputFile::rawTileData (
    int&         dx,
    int&         dy,
    int&         lx,
    int&         ly,
    const char*& pixelData,
    int&         pixelDataSize)
{
    exr_chunk_info_t cinfo;
    if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
            _ctxt, _data->partNumber, dx, dy, lx, ly, &cinfo))
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (_data->_mx);
#endif
        _data->_tile_data_scratch.resize (cinfo.packed_size);
        pixelDataSize = static_cast<int> (cinfo.packed_size);
        if (EXR_ERR_SUCCESS !=
            exr_read_chunk (_ctxt, _data->partNumber, &cinfo,
                            _data->_tile_data_scratch.data ()))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName () << "\". Unable to read raw tile data of "
                    << pixelDataSize << " bytes.");
        }
        pixelData = _data->_tile_data_scratch.data ();
        dx = cinfo.start_x;
        dy = cinfo.start_y;
        lx = cinfo.level_x;
        ly = cinfo.level_y;
    }
    else
    {
        if (!isValidTile (dx, dy, lx, ly))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                << fileName () << "\". "
                << "Tried to read a tile outside "
                "the image file's data window.");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading chunk information for tile from image "
                "file \""
                << fileName () << "\". Unable to read raw tile offset information.");
        }
    }
}